

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O3

void __thiscall GibbsSamplerFromHDP::storeSamples(GibbsSamplerFromHDP *this)

{
  uint uVar1;
  pointer puVar2;
  pointer pdVar3;
  pointer pvVar4;
  pointer pvVar5;
  long lVar6;
  long lVar7;
  pointer pvVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  this->_samplingCount = this->_samplingCount + 1;
  uVar11 = (ulong)this->_K;
  if (uVar11 != 0) {
    puVar2 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->_sumOfNkSampled).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      pdVar3[uVar10] = (double)puVar2[uVar10] + pdVar3[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
    if (uVar11 != 0) {
      uVar1 = this->_V;
      pvVar4 = (this->_nkv).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar5 = (this->_sumOfNkvSampled).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        if ((ulong)uVar1 != 0) {
          lVar6 = *(long *)&pvVar4[uVar10].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data;
          lVar7 = *(long *)&pvVar5[uVar10].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data;
          uVar12 = 0;
          do {
            *(double *)(lVar7 + uVar12 * 8) =
                 (double)*(uint *)(lVar6 + uVar12 * 4) + *(double *)(lVar7 + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while (uVar1 != uVar12);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar11);
    }
  }
  uVar1 = this->_J;
  if ((ulong)uVar1 != 0) {
    puVar2 = (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar4 = (this->_kjt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (this->_njt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (this->_sumOfNjkSampled).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      uVar10 = (ulong)puVar2[uVar11];
      if (uVar10 != 0) {
        lVar6 = *(long *)&pvVar8[uVar11].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        lVar7 = *(long *)&pvVar4[uVar11].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        lVar9 = *(long *)&pvVar5[uVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        uVar12 = 0;
        do {
          uVar13 = (ulong)*(uint *)(lVar7 + uVar12 * 4);
          *(double *)(lVar9 + uVar13 * 8) =
               (double)*(uint *)(lVar6 + uVar12 * 4) + *(double *)(lVar9 + uVar13 * 8);
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar1);
  }
  return;
}

Assistant:

void GibbsSamplerFromHDP::storeSamples(){//{{{
    _samplingCount++;
    for(int k=0; k<_K; k++){
        _sumOfNkSampled[k] += _nk[k];
    }
    //nkv
    for(int k=0; k<_K; k++){
        for(int v=0; v<_V; v++){
            _sumOfNkvSampled[k][v] += _nkv[k][v];
        }
    }
    //njk
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            _sumOfNjkSampled[j][_kjt[j][t]] += _njt[j][t];
        }
    }
}